

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O1

void Ivy_FraigInsertClass(Ivy_FraigList_t *pList,Ivy_Obj_t *pBase,Ivy_Obj_t *pClass)

{
  pClass->pPrevFan1 = pBase;
  pClass->pPrevFan0 = pBase->pPrevFan0;
  if (pBase->pPrevFan0 != (Ivy_Obj_t *)0x0) {
    pBase->pPrevFan0->pPrevFan1 = pClass;
  }
  pBase->pPrevFan0 = pClass;
  if (pList->pTail == pBase) {
    pList->pTail = pClass;
  }
  pList->nItems = pList->nItems + 1;
  return;
}

Assistant:

void Ivy_FraigInsertClass( Ivy_FraigList_t * pList, Ivy_Obj_t * pBase, Ivy_Obj_t * pClass )
{
    Ivy_ObjSetEquivListPrev( pClass, pBase );
    Ivy_ObjSetEquivListNext( pClass, Ivy_ObjEquivListNext(pBase) ); 
    if ( Ivy_ObjEquivListNext(pBase) )
        Ivy_ObjSetEquivListPrev( Ivy_ObjEquivListNext(pBase), pClass );
    Ivy_ObjSetEquivListNext( pBase, pClass ); 
    if ( pList->pTail == pBase )
        pList->pTail = pClass;
    pList->nItems++;
}